

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpi.c
# Opt level: O3

int Waitany(IceTCommunicator self,int count,IceTCommRequest *array_of_requests)

{
  ulong uVar1;
  void *__ptr;
  MPI_Request poVar2;
  ulong uVar3;
  int iVar4;
  int local_2c;
  
  uVar1 = (ulong)(uint)count;
  __ptr = malloc((long)count << 3);
  if (__ptr == (void *)0x0) {
    icetRaiseDiagnostic("Could not allocate array for MPI requests.",0xfffffffc,1,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/kmorel[P]IceT/src/communication/mpi.c"
                        ,0x1b7);
    iVar4 = -1;
  }
  else {
    if (count < 1) {
      count = 0;
    }
    else {
      uVar3 = 0;
      do {
        poVar2 = getMPIRequest(array_of_requests[uVar3]);
        *(MPI_Request *)((long)__ptr + uVar3 * 8) = poVar2;
        uVar3 = uVar3 + 1;
      } while (uVar1 != uVar3);
    }
    local_2c = count;
    MPI_Waitany(uVar1,__ptr,&local_2c,0);
    setMPIRequest(array_of_requests[local_2c],*(MPI_Request *)((long)__ptr + (long)local_2c * 8));
    destroy_request(array_of_requests[local_2c]);
    iVar4 = local_2c;
    array_of_requests[local_2c] = (IceTCommRequest)0x0;
    free(__ptr);
  }
  return iVar4;
}

Assistant:

static int  Waitany(IceTCommunicator self,
                    int count, IceTCommRequest *array_of_requests)
{
    MPI_Request *mpi_requests;
    int idx;

    /* To remove warning */
    (void)self;

    mpi_requests = malloc(sizeof(MPI_Request)*count);
    if (mpi_requests == NULL) {
        icetRaiseError("Could not allocate array for MPI requests.",
                       ICET_OUT_OF_MEMORY);
        return -1;
    }

    for (idx = 0; idx < count; idx++) {
        mpi_requests[idx] = getMPIRequest(array_of_requests[idx]);
    }

    MPI_Waitany(count, mpi_requests, &idx, MPI_STATUS_IGNORE);

    setMPIRequest(array_of_requests[idx], mpi_requests[idx]);
    destroy_request(array_of_requests[idx]);
    array_of_requests[idx] = ICET_COMM_REQUEST_NULL;

    free(mpi_requests);

    return idx;
}